

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  int iVar2;
  const_reference this;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  int i;
  int index;
  
  index = 0;
  sVar5 = 0;
  while( true ) {
    iVar2 = RepeatedField<google::protobuf::UnknownField>::size(&unknown_fields->fields_);
    if (iVar2 <= index) break;
    this = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,index);
    if (this->type_ == 3) {
      uVar4 = this->number_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar3 = UnknownField::GetLengthDelimitedSize(this);
      uVar4 = (uint)sVar3 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = (long)(int)(uint)sVar3 + sVar5 + 4 + (ulong)(iVar1 * 9 + 0x49U >> 6) +
              (ulong)(iVar2 * 9 + 0x49U >> 6);
    }
    index = index + 1;
  }
  return sVar5;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}